

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Sphere::Intersect(Sphere *this,Ray *ray,Float tMax)

{
  undefined1 auVar1 [16];
  bool bVar2;
  QuadricIntersection *pQVar3;
  optional<pbrt::ShapeIntersection> *in_RDI;
  undefined8 uVar4;
  Vector3<float> VVar5;
  SurfaceInteraction intr;
  optional<pbrt::QuadricIntersection> isect;
  Float in_stack_0000030c;
  Ray *in_stack_00000310;
  Sphere *in_stack_00000318;
  Float in_stack_000005ac;
  QuadricIntersection *in_stack_000005b0;
  Sphere *in_stack_000005b8;
  Tuple3<pbrt::Vector3,_float> in_stack_000005d0;
  ShapeIntersection *in_stack_fffffffffffffd28;
  SurfaceInteraction *in_stack_fffffffffffffd30;
  optional<pbrt::ShapeIntersection> *this_00;
  optional<pbrt::ShapeIntersection> local_178;
  undefined4 local_48;
  optional local_34 [52];
  
  uVar4 = 0;
  BasicIntersect(in_stack_00000318,in_stack_00000310,in_stack_0000030c);
  bVar2 = pstd::optional::operator_cast_to_bool(local_34);
  if (bVar2) {
    pstd::optional<pbrt::QuadricIntersection>::operator*
              ((optional<pbrt::QuadricIntersection> *)0x6dd68d);
    VVar5 = Tuple3<pbrt::Vector3,_float>::operator-
                      ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffd30);
    local_178.optionalValue._16_4_ = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar1._8_8_ = uVar4;
    auVar1._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_178.optionalValue._8_8_ = vmovlpd_avx(auVar1);
    local_178.optionalValue._24_8_ = local_178.optionalValue._8_8_;
    local_178.optionalValue._32_4_ = local_178.optionalValue._16_4_;
    local_178.optionalValue._40_8_ = local_178.optionalValue._8_8_;
    local_178.optionalValue._48_4_ = local_178.optionalValue._16_4_;
    InteractionFromIntersection
              (in_stack_000005b8,in_stack_000005b0,(Vector3f)in_stack_000005d0,in_stack_000005ac);
    SurfaceInteraction::SurfaceInteraction
              (in_stack_fffffffffffffd30,&in_stack_fffffffffffffd28->intr);
    this_00 = &local_178;
    pQVar3 = pstd::optional<pbrt::QuadricIntersection>::operator->
                       ((optional<pbrt::QuadricIntersection> *)0x6dd773);
    *(Float *)&this_00->optionalValue = pQVar3->tHit;
    pstd::optional<pbrt::ShapeIntersection>::optional(this_00,in_stack_fffffffffffffd28);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  local_48 = 1;
  pstd::optional<pbrt::QuadricIntersection>::~optional
            ((optional<pbrt::QuadricIntersection> *)0x6dd7b5);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeIntersection> Intersect(const Ray &ray,
                                                Float tMax = Infinity) const {
        pstd::optional<QuadricIntersection> isect = BasicIntersect(ray, tMax);
        if (!isect)
            return {};
        SurfaceInteraction intr = InteractionFromIntersection(*isect, -ray.d, ray.time);
        return ShapeIntersection{intr, isect->tHit};
    }